

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_apply_difficulty_factors.hpp
# Opt level: O3

void __thiscall
PatchApplyDifficultyFactors::alter_world(PatchApplyDifficultyFactors *this,World *world)

{
  EnemyType *this_00;
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var2 = (world->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(world->_entity_types)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      (*(code *)**(undefined8 **)p_Var2[1]._M_parent)(&local_50);
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_50,"enemy");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar1 == 0) {
        this_00 = (EnemyType *)p_Var2[1]._M_parent;
        EnemyType::apply_damage_factor
                  (this_00,(double)this->_options->_enemies_damage_factor / 100.0);
        EnemyType::apply_health_factor
                  (this_00,(double)this->_options->_enemies_health_factor / 100.0);
        EnemyType::apply_armor_factor(this_00,(double)this->_options->_enemies_armor_factor / 100.0)
        ;
        EnemyType::apply_golds_factor(this_00,(double)this->_options->_enemies_golds_factor / 100.0)
        ;
        EnemyType::apply_drop_chance_factor
                  (this_00,(double)this->_options->_enemies_drop_chance_factor / 100.0);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void alter_world(World& world) override
    {
        // Apply multiplicators from randomizer settings
        for (auto& [id, entity_type] : world.entity_types())
        {
            if(entity_type->type_name() != "enemy")
                continue;
            EnemyType* enemy_type = reinterpret_cast<EnemyType*>(entity_type);

            enemy_type->apply_damage_factor(_options.enemies_damage_factor());
            enemy_type->apply_health_factor(_options.enemies_health_factor());
            enemy_type->apply_armor_factor(_options.enemies_armor_factor());
            enemy_type->apply_golds_factor(_options.enemies_golds_factor());
            enemy_type->apply_drop_chance_factor(_options.enemies_drop_chance_factor());
        }
    }